

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetwindow.cpp
# Opt level: O2

bool __thiscall QWidgetWindowPrivate::participatesInLastWindowClosed(QWidgetWindowPrivate *this)

{
  bool bVar1;
  undefined1 uVar2;
  
  bVar1 = QWidget::testAttribute_helper
                    (*(QWidget **)(*(long *)&this->field_0x8 + 0x30),WA_QuitOnClose);
  if (bVar1) {
    uVar2 = QWindowPrivate::participatesInLastWindowClosed();
    return (bool)uVar2;
  }
  return false;
}

Assistant:

bool QWidgetWindowPrivate::participatesInLastWindowClosed() const
{
    Q_Q(const QWidgetWindow);

    // For historical reasons WA_QuitOnClose has been closely tied
    // to the lastWindowClosed signal, since the default behavior
    // is to quit the application after emitting lastWindowClosed.
    // ### Qt 7: Rename this attribute, or decouple behavior.
    if (!q->widget()->testAttribute(Qt::WA_QuitOnClose))
        return false;

    return QWindowPrivate::participatesInLastWindowClosed();
}